

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  bool bVar1;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t sVar2;
  TypeSig *pTVar3;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  char *__n_00;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  basic_string_view<char,_std::char_traits<char>_> *first;
  basic_string_view<char,_std::char_traits<char>_> *first_00;
  void *__buf_03;
  void *__buf_04;
  undefined4 in_register_00000034;
  TypeDef *type;
  basic_string_view<char,_std::char_traits<char>_> local_548;
  basic_string_view<char,_std::char_traits<char>_> local_538;
  basic_string_view<char,_std::char_traits<char>_> local_528;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_518;
  size_t local_508;
  char *local_500;
  basic_string_view<char,_std::char_traits<char>_> local_4f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4e8;
  size_t local_4d8;
  char *local_4d0;
  basic_string_view<char,_std::char_traits<char>_> local_4c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4b8;
  size_t local_4a8;
  char *local_4a0;
  basic_string_view<char,_std::char_traits<char>_> local_498;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_488;
  size_t local_478;
  char *local_470;
  basic_string_view<char,_std::char_traits<char>_> local_468;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_458;
  size_t local_448;
  char *local_440;
  basic_string_view<char,_std::char_traits<char>_> local_438;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_428;
  size_t local_418;
  char *local_410;
  basic_string_view<char,_std::char_traits<char>_> local_408;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3f8;
  size_t local_3e8;
  char *local_3e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3d8;
  char *local_3c8;
  char *local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_3b8;
  pair<winmd::reader::Field,_winmd::reader::Field> local_3a8;
  FieldSig local_388;
  string local_2e0;
  basic_string_view<char,_std::char_traits<char>_> local_2c0 [2];
  string local_2a0;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_260;
  char *local_250;
  char *local_248;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_240;
  size_t local_230;
  char *local_228;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_220;
  size_t local_210;
  char *local_208;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_200;
  size_t local_1f0;
  char *local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  char *local_1c0;
  char *local_1b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1b0;
  size_t local_1a0;
  char *local_198;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_190;
  size_t local_180;
  char *local_178;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  char *local_150;
  char *local_148;
  category local_13c;
  undefined1 local_138 [4];
  category category;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  char *local_118;
  char *local_110;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_108;
  size_t local_f8;
  char *local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  char *local_c8;
  char *local_c0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  size_t local_a8;
  char *local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  anon_class_16_2_560cd874 local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  string_view name;
  string_view ns;
  TypeDef *type_local;
  writer *this_local;
  
  type = (TypeDef *)CONCAT44(in_register_00000034,__fd);
  add_depends(this,type);
  join_0x00000010_0x00000000_ = winmd::reader::TypeDef::TypeNamespace(type);
  join_0x00000010_0x00000000_ = winmd::reader::TypeDef::TypeName(type);
  winmd::reader::TypeDef::GenericParam
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)local_58,type);
  bVar1 = winmd::reader::empty<winmd::reader::GenericParam>
                    ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)local_58);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"winrt::@::%<%>");
    local_78 = remove_tick((string_view *)
                           &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,", ");
    local_88 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                         (&local_98,
                          (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)local_58
                         );
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,cppwinrt::bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>(std::basic_string_view<char,std::char_traits<char>>const&,std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>const&)::_lambda(auto:1&)_1_>
              (&this->super_writer_base<cppwinrt::writer>,&local_68,
               (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,&local_78,&local_88)
    ;
    return extraout_RAX;
  }
  local_a8 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
  local_a0 = (char *)name._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b8,"EventRegistrationToken");
  __x_18._M_str = local_a0;
  __x_18._M_len = local_a8;
  bVar1 = ::std::operator==(__x_18,local_b8);
  if (bVar1) {
    local_c8 = name._M_str;
    local_c0 = (char *)ns._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d8,"Windows.Foundation");
    __x_17._M_str = local_c0;
    __x_17._M_len = (size_t)local_c8;
    __y_02._M_str = local_d8._M_str;
    __y_02._M_len = local_d8._M_len;
    bVar1 = ::std::operator==(__x_17,__y_02);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,"winrt::event_token");
      sVar2 = writer_base<cppwinrt::writer>::write
                        (&this->super_writer_base<cppwinrt::writer>,(int)&local_e8,__buf_00,
                         (size_t)local_d8._M_str);
      return sVar2;
    }
  }
  local_f8 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
  local_f0 = (char *)name._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"HResult");
  __x_16._M_str = local_f0;
  __x_16._M_len = local_f8;
  bVar1 = ::std::operator==(__x_16,local_108);
  if (bVar1) {
    local_118 = name._M_str;
    local_110 = (char *)ns._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_128,"Windows.Foundation");
    __x_15._M_str = local_110;
    __x_15._M_len = (size_t)local_118;
    __y_01._M_str = local_128._M_str;
    __y_01._M_len = local_128._M_len;
    bVar1 = ::std::operator==(__x_15,__y_01);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_138,"winrt::hresult");
      sVar2 = writer_base<cppwinrt::writer>::write
                        (&this->super_writer_base<cppwinrt::writer>,(int)local_138,__buf_01,
                         (size_t)local_128._M_str);
      return sVar2;
    }
  }
  if ((this->abi_types & 1U) == 0) {
    local_3c8 = name._M_str;
    local_3c0 = (char *)ns._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3d8,"Windows.Foundation.Numerics");
    __x_06._M_str = local_3c0;
    __x_06._M_len = (size_t)local_3c8;
    bVar1 = ::std::operator==(__x_06,local_3d8);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_548,"winrt::@::%");
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&this->super_writer_base<cppwinrt::writer>,&local_548,
                 (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
      return extraout_RAX_04;
    }
    local_3e8 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
    local_3e0 = (char *)name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f8,"Matrix3x2")
    ;
    __x_05._M_str = local_3e0;
    __x_05._M_len = local_3e8;
    bVar1 = ::std::operator==(__x_05,local_3f8);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_408,"float3x2");
      name._M_len = (size_t)local_408._M_str;
      generics.second.super_row_base<winmd::reader::GenericParam>._8_8_ = local_408._M_len;
    }
    else {
      local_418 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
      local_410 = (char *)name._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_428,"Matrix4x4");
      __x_04._M_str = local_410;
      __x_04._M_len = local_418;
      bVar1 = ::std::operator==(__x_04,local_428);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_438,"float4x4");
        name._M_len = (size_t)local_438._M_str;
        generics.second.super_row_base<winmd::reader::GenericParam>._8_8_ = local_438._M_len;
      }
      else {
        local_448 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
        local_440 = (char *)name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_458,"Plane")
        ;
        __x_03._M_str = local_440;
        __x_03._M_len = local_448;
        bVar1 = ::std::operator==(__x_03,local_458);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_468,"plane");
          name._M_len = (size_t)local_468._M_str;
          generics.second.super_row_base<winmd::reader::GenericParam>._8_8_ = local_468._M_len;
        }
        else {
          local_478 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
          local_470 = (char *)name._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_488,"Quaternion");
          __x_02._M_str = local_470;
          __x_02._M_len = local_478;
          bVar1 = ::std::operator==(__x_02,local_488);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_498,"quaternion");
            name._M_len = (size_t)local_498._M_str;
            generics.second.super_row_base<winmd::reader::GenericParam>._8_8_ = local_498._M_len;
          }
          else {
            local_4a8 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
            local_4a0 = (char *)name._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_4b8,"Vector2");
            __x_01._M_str = local_4a0;
            __x_01._M_len = local_4a8;
            bVar1 = ::std::operator==(__x_01,local_4b8);
            if (bVar1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_4c8,"float2");
              name._M_len = (size_t)local_4c8._M_str;
              generics.second.super_row_base<winmd::reader::GenericParam>._8_8_ = local_4c8._M_len;
            }
            else {
              local_4d8 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
              local_4d0 = (char *)name._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_4e8,"Vector3");
              __x_00._M_str = local_4d0;
              __x_00._M_len = local_4d8;
              bVar1 = ::std::operator==(__x_00,local_4e8);
              if (bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_4f8,"float3");
                name._M_len = (size_t)local_4f8._M_str;
                generics.second.super_row_base<winmd::reader::GenericParam>._8_8_ = local_4f8._M_len
                ;
              }
              else {
                local_508 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
                local_500 = (char *)name._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_518,"Vector4");
                __x._M_str = local_500;
                __x._M_len = local_508;
                bVar1 = ::std::operator==(__x,local_518);
                if (bVar1) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_528,"float4");
                  name._M_len = (size_t)local_528._M_str;
                  generics.second.super_row_base<winmd::reader::GenericParam>._8_8_ =
                       local_528._M_len;
                }
              }
            }
          }
        }
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_538,"winrt::@::%");
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (&this->super_writer_base<cppwinrt::writer>,&local_538,
               (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,
               (basic_string_view<char,_std::char_traits<char>_> *)
               &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
    return extraout_RAX_03;
  }
  local_13c = winmd::reader::get_category(type);
  local_150 = name._M_str;
  local_148 = (char *)ns._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_160,"Windows.Foundation.Numerics");
  __x_14._M_str = local_148;
  __x_14._M_len = (size_t)local_150;
  __y_00._M_str = local_160._M_str;
  __y_00._M_len = local_160._M_len;
  bVar1 = ::std::operator==(__x_14,__y_00);
  __n_00 = local_160._M_str;
  if ((bVar1) &&
     (bVar1 = transform_special_numeric_type
                        ((string_view *)
                         &generics.second.super_row_base<winmd::reader::GenericParam>.m_index),
     __n_00 = local_160._M_str, bVar1)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_170,"winrt::@::%");
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (&this->super_writer_base<cppwinrt::writer>,&local_170,
               (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,
               (basic_string_view<char,_std::char_traits<char>_> *)
               &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
    return extraout_RAX_00;
  }
  if (local_13c != struct_type) {
    if (local_13c == enum_type) {
      winmd::reader::TypeDef::FieldList(&local_3a8,type);
      winmd::reader::Field::Signature(&local_388,&local_3a8.first);
      pTVar3 = winmd::reader::FieldSig::Type(&local_388);
      write(this,(int)pTVar3,__buf_03,(size_t)__n_00);
      winmd::reader::FieldSig::~FieldSig(&local_388);
      return extraout_RAX_02;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b8,"void*");
    sVar2 = writer_base<cppwinrt::writer>::write
                      (&this->super_writer_base<cppwinrt::writer>,(int)&local_3b8,__buf_04,
                       (size_t)__n_00);
    return sVar2;
  }
  local_180 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
  local_178 = (char *)name._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"DateTime");
  __x_13._M_str = local_178;
  __x_13._M_len = local_180;
  bVar1 = ::std::operator==(__x_13,local_190);
  if (bVar1) {
LAB_0016a213:
    local_1c0 = name._M_str;
    local_1b8 = (char *)ns._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d0,"Windows.Foundation");
    __x_11._M_str = local_1b8;
    __x_11._M_len = (size_t)local_1c0;
    __y._M_str = local_1d0._M_str;
    __y._M_len = local_1d0._M_len;
    bVar1 = ::std::operator==(__x_11,__y);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,"int64_t")
      ;
      sVar2 = writer_base<cppwinrt::writer>::write
                        (&this->super_writer_base<cppwinrt::writer>,(int)&local_1e0,__buf_02,
                         (size_t)local_1d0._M_str);
      return sVar2;
    }
  }
  else {
    local_1a0 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
    local_198 = (char *)name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,"TimeSpan");
    __x_12._M_str = local_198;
    __x_12._M_len = local_1a0;
    bVar1 = ::std::operator==(__x_12,local_1b0);
    if (bVar1) goto LAB_0016a213;
  }
  local_1f0 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
  local_1e8 = (char *)name._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,"Point");
  __x_10._M_str = local_1e8;
  __x_10._M_len = local_1f0;
  bVar1 = ::std::operator==(__x_10,local_200);
  if (!bVar1) {
    local_210 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
    local_208 = (char *)name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_220,"Size");
    __x_09._M_str = local_208;
    __x_09._M_len = local_210;
    bVar1 = ::std::operator==(__x_09,local_220);
    if (!bVar1) {
      local_230 = generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
      local_228 = (char *)name._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_240,"Rect");
      __x_08._M_str = local_228;
      __x_08._M_len = local_230;
      bVar1 = ::std::operator==(__x_08,local_240);
      if (!bVar1) goto LAB_0016a404;
    }
  }
  local_250 = name._M_str;
  local_248 = (char *)ns._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_260,"Windows.Foundation");
  __x_07._M_str = local_248;
  __x_07._M_len = (size_t)local_250;
  bVar1 = ::std::operator==(__x_07,local_260);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_270,"winrt::@::%");
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (&this->super_writer_base<cppwinrt::writer>,&local_270,
               (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,
               (basic_string_view<char,_std::char_traits<char>_> *)
               &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
    return extraout_RAX_01;
  }
LAB_0016a404:
  if ((this->delegate_types & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_2c0,"struct struct_%_%");
    get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
              (&local_2e0,(cppwinrt *)&name._M_str,first_00);
    writer_base<cppwinrt::writer>::
    write<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (&this->super_writer_base<cppwinrt::writer>,local_2c0,&local_2e0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
    sVar2 = ::std::__cxx11::string::~string((string *)&local_2e0);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_280,"struct impl::struct_%_%");
    get_impl_name<std::basic_string_view<char,std::char_traits<char>>>
              (&local_2a0,(cppwinrt *)&name._M_str,first);
    writer_base<cppwinrt::writer>::
    write<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (&this->super_writer_base<cppwinrt::writer>,&local_280,&local_2a0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
    sVar2 = ::std::__cxx11::string::~string((string *)&local_2a0);
  }
  return sVar2;
}

Assistant:

void write(TypeDef const& type)
        {
            add_depends(type);
            auto ns = type.TypeNamespace();
            auto name = type.TypeName();
            auto generics = type.GenericParam();

            if (!empty(generics))
            {
                write("winrt::@::%<%>", ns, remove_tick(name), bind_list(", ", generics));
                return;
            }

            if (name == "EventRegistrationToken" && ns == "Windows.Foundation")
            {
                write("winrt::event_token");
            }
            else if (name == "HResult" && ns == "Windows.Foundation")
            {
                write("winrt::hresult");
            }
            else if (abi_types)
            {
                auto category = get_category(type);

                if (ns == "Windows.Foundation.Numerics" && transform_special_numeric_type(name))
                {
                    write("winrt::@::%", ns, name);
                }
                else if (category == category::struct_type)
                {
                    if ((name == "DateTime" || name == "TimeSpan") && ns == "Windows.Foundation")
                    {
                        write("int64_t");
                    }
                    else if ((name == "Point" || name == "Size" || name == "Rect") && ns == "Windows.Foundation")
                    {
                        write("winrt::@::%", ns, name);
                    }
                    else if (delegate_types)
                    {
                        write("struct impl::struct_%_%", get_impl_name(ns), name);
                    }
                    else
                    {
                        write("struct struct_%_%", get_impl_name(ns), name);
                    }
                }
                else if (category == category::enum_type)
                {
                    write(type.FieldList().first.Signature().Type());
                }
                else
                {
                    write("void*");
                }
            }
            else
            {
                if (ns == "Windows.Foundation.Numerics")
                {
                    if (name == "Matrix3x2") { name = "float3x2"; }
                    else if (name == "Matrix4x4") { name = "float4x4"; }
                    else if (name == "Plane") { name = "plane"; }
                    else if (name == "Quaternion") { name = "quaternion"; }
                    else if (name == "Vector2") { name = "float2"; }
                    else if (name == "Vector3") { name = "float3"; }
                    else if (name == "Vector4") { name = "float4"; }

                    write("winrt::@::%", ns, name);
                }
                else
                {
                    write("winrt::@::%", ns, name);
                }
            }
        }